

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_lod_invalid_lod
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  RenderContext *pRVar4;
  char *__s;
  DataType dataType;
  DataType lodDataType;
  undefined1 *in_stack_fffffffffffffb98;
  bool local_301;
  string local_300;
  undefined1 local_2e0 [8];
  string shaderSource_8;
  undefined1 local_2a0 [8];
  string shaderSource_7;
  undefined1 local_260 [8];
  string shaderSource_6;
  undefined1 local_220 [8];
  string shaderSource_5;
  undefined1 local_1e0 [8];
  string shaderSource_4;
  undefined1 local_1a0 [8];
  string shaderSource_3;
  undefined1 local_160 [8];
  string shaderSource_2;
  undefined1 local_120 [8];
  string shaderSource_1;
  undefined1 local_e0 [8];
  string shaderSource;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  allocator<char> local_71;
  int shaderNdx;
  byte local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  pRVar4 = NegativeTestContext::getRenderContext(ctx);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(local_14,(ApiType)local_18);
  pNVar2 = local_10;
  local_39 = 0;
  local_301 = true;
  if (!bVar3) {
    (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)0x2d,dataType);
    local_39 = 1;
    local_301 = NegativeTestContext::isExtensionSupported(pNVar2,&local_38);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  pNVar2 = local_10;
  if (local_301 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderNdx,"textureLod: Invalid lod type.",&local_71);
    NegativeTestContext::beginSection(pNVar2,(string *)&shaderNdx);
    std::__cxx11::string::~string((string *)&shaderNdx);
    std::allocator<char>::~allocator(&local_71);
    for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
      bVar3 = NegativeTestContext::isShaderSupported
                        (local_10,*(ShaderType *)
                                   ((anonymous_namespace)::s_shaders + (long)local_78 * 4));
      pNVar2 = local_10;
      if (bVar3) {
        __s = glu::getShaderTypeName
                        (*(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dataTypeNdx,__s,
                   (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
        std::operator+(&local_98,"Verify shader: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dataTypeNdx);
        NegativeTestContext::beginSection(pNVar2,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&dataTypeNdx);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
        for (shaderSource.field_2._8_4_ = 0; lodDataType = (DataType)in_stack_fffffffffffffb98,
            (int)shaderSource.field_2._8_4_ < 4;
            shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
          if (*(int *)((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 1) {
            (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                      ((string *)local_e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x2d,
                       TYPE_FLOAT,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),lodDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_e0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_e0);
            (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                      ((string *)local_120,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x3a,
                       TYPE_FLOAT,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),lodDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_120);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_120);
            (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                      ((string *)local_160,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x41,
                       TYPE_FLOAT,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),lodDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_160);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_160);
          }
          (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)local_1a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x2d,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),lodDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_1a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1a0);
          (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)local_1e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x3a,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),lodDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1e0);
          (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)local_220,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x41,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),lodDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_220);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_220);
          (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)local_260,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x2d,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),lodDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_260);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_260);
          (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)local_2a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x3a,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),lodDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_2a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2a0);
          in_stack_fffffffffffffb98 = (anonymous_namespace)::s_shaders;
          (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                    ((string *)local_2e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_78 * 4),0x41,
                     TYPE_FLOAT_VEC4,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),0xf65050);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)(in_stack_fffffffffffffb98 + (long)local_78 * 4);
          std::__cxx11::string::string((string *)&local_300,(string *)local_2e0);
          verifyShader(pNVar2,SVar1,&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)local_2e0);
        }
        NegativeTestContext::endSection(local_10);
      }
    }
    NegativeTestContext::endSection(local_10);
  }
  return;
}

Assistant:

void texture_lod_invalid_lod (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("textureLod: Invalid lod type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT)
					{
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}